

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_kv_note(emitter_t *emitter,char *json_key,char *table_key,emitter_type_t value_type,
                    void *value,char *table_note_key,emitter_type_t table_note_value_type,
                    void *table_note_value)

{
  if (emitter->output < emitter_output_table) {
    emitter_json_key(emitter,json_key);
    emitter_json_value(emitter,value_type,value);
  }
  else if (emitter->output == emitter_output_table) {
    emitter_indent(emitter);
    emitter_printf(emitter,"%s: ",table_key);
    emitter_print_value(emitter,emitter_justify_none,-1,value_type,value);
    if (table_note_key != (char *)0x0) {
      emitter_printf(emitter," (%s: ",table_note_key);
      emitter_print_value(emitter,emitter_justify_none,-1,table_note_value_type,table_note_value);
      emitter_printf(emitter,")");
    }
    emitter_printf(emitter,anon_var_dwarf_3b2a754 + 8);
  }
  emitter->item_at_depth = true;
  return;
}

Assistant:

static inline void
emitter_kv_note(emitter_t *emitter, const char *json_key, const char *table_key,
    emitter_type_t value_type, const void *value,
    const char *table_note_key, emitter_type_t table_note_value_type,
    const void *table_note_value) {
	if (emitter_outputs_json(emitter)) {
		emitter_json_key(emitter, json_key);
		emitter_json_value(emitter, value_type, value);
	} else {
		emitter_table_kv_note(emitter, table_key, value_type, value,
		    table_note_key, table_note_value_type, table_note_value);
	}
	emitter->item_at_depth = true;
}